

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

var __thiscall cs::function::call_el(function *this,function *_this,vector *args)

{
  undefined *puVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [4];
  string local_50;
  
  puVar1 = current_process;
  if ((*current_process & 1) != 0) {
    LOCK();
    *current_process = 0;
    UNLOCK();
    event_type::touch((event_type *)(puVar1 + 0xd0),(void *)0x0);
  }
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0[0]._M_dataplus._M_p =
         (pointer)(*(_this->mBody).
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur)[1]._vptr_statement_base;
    runtime_type::parse_expr
              ((runtime_type *)this,
               (iterator *)
               (((_this->mContext).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,SUB81(local_d0,0));
    return (var)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string
            (&local_50,
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(local_d0,"Wrong size of arguments. Expected none, provided ",&local_50);
  runtime_error::runtime_error(this_00,local_d0);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var function::call_el(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (!args.empty())
			throw runtime_error("Wrong size of arguments. Expected none, provided " + std::to_string(args.size()));
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#endif
		try {
			return _this->mContext->instance->parse_expr(static_cast<const statement_return *>(_this->mBody.front())->get_tree().root());
		}
		catch (const cs::exception &e) {
			throw e;
		}
		catch (const std::exception &e) {
			const statement_base *ptr = _this->mBody.front();
			throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
		}
	}